

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::usage
          (CommandLine<Catch::ConfigData> *this,ostream *os,string *procName)

{
  bool bVar1;
  ostream *poVar2;
  string *procName_local;
  ostream *os_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  validate(this);
  poVar2 = std::operator<<((ostream *)os,"usage:\n  ");
  poVar2 = std::operator<<(poVar2,(string *)procName);
  std::operator<<(poVar2," ");
  argSynopsis(this,os);
  bVar1 = std::
          vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::empty(&this->m_options);
  if (!bVar1) {
    std::operator<<((ostream *)os," [options]\n\nwhere options are: \n");
    optUsage(this,os,2,0x50);
  }
  std::operator<<((ostream *)os,"\n");
  return;
}

Assistant:

void usage( std::ostream& os, std::string const& procName ) const {
            validate();
            os << "usage:\n  " << procName << " ";
            argSynopsis( os );
            if( !m_options.empty() ) {
                os << " [options]\n\nwhere options are: \n";
                optUsage( os, 2 );
            }
            os << "\n";
        }